

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

char * nk_itoa(char *s,long n)

{
  char cVar1;
  uint uVar2;
  char *in_RAX;
  char *pcVar3;
  byte *pbVar4;
  ulong uVar5;
  char *pcVar6;
  char *str;
  bool bVar7;
  
  bVar7 = n < 0;
  if (n == 0) {
    s[0] = '0';
    s[1] = '\0';
    return in_RAX;
  }
  if (bVar7) {
    *s = '-';
    n = -n;
  }
  pbVar4 = (byte *)(s + bVar7);
  for (; 0 < n; n = (ulong)n / 10) {
    *pbVar4 = (byte)((ulong)n % 10) | 0x30;
    pbVar4 = pbVar4 + 1;
  }
  *pbVar4 = 0;
  str = s + (*s == '-');
  uVar2 = nk_strlen(str);
  uVar5 = (ulong)uVar2;
  pcVar6 = (char *)0x0;
  pcVar3 = (char *)((long)(int)uVar2 / 2 & 0xffffffff);
  if ((int)((long)(int)uVar2 / 2) < 1) {
    pcVar3 = pcVar6;
  }
  for (; pcVar3 != pcVar6; pcVar6 = pcVar6 + 1) {
    cVar1 = str[(long)pcVar6];
    uVar5 = (ulong)((int)uVar5 + -1);
    str[(long)pcVar6] = str[uVar5];
    str[uVar5] = cVar1;
  }
  return pcVar3;
}

Assistant:

NK_INTERN char*
nk_itoa(char *s, long n)
{
    long i = 0;
    if (n == 0) {
        s[i++] = '0';
        s[i] = 0;
        return s;
    }
    if (n < 0) {
        s[i++] = '-';
        n = -n;
    }
    while (n > 0) {
        s[i++] = (char)('0' + (n % 10));
        n /= 10;
    }
    s[i] = 0;
    if (s[0] == '-')
        ++s;

    nk_strrev_ascii(s);
    return s;
}